

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_set_option(spng_ctx *ctx,spng_option option,int value)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 1;
  if (ctx == (spng_ctx *)0x0) {
    return 1;
  }
  if (ctx->state == SPNG_STATE_INVALID) {
    return 0x46;
  }
  switch(option) {
  case SPNG_KEEP_UNKNOWN_CHUNKS:
    *(ushort *)&ctx->field_0xcc =
         (ushort)*(undefined4 *)&ctx->field_0xcc & 0xfeff | (ushort)(value != 0) << 8;
    break;
  case SPNG_IMG_COMPRESSION_LEVEL:
    (ctx->image_options).compression_level = value;
    break;
  case SPNG_IMG_WINDOW_BITS:
    (ctx->image_options).window_bits = value;
    break;
  case SPNG_IMG_MEM_LEVEL:
    (ctx->image_options).mem_level = value;
    break;
  case SPNG_IMG_COMPRESSION_STRATEGY:
    (ctx->image_options).strategy = value;
    break;
  case SPNG_TEXT_COMPRESSION_LEVEL:
    (ctx->text_options).compression_level = value;
    break;
  case SPNG_TEXT_WINDOW_BITS:
    (ctx->text_options).window_bits = value;
    break;
  case SPNG_TEXT_MEM_LEVEL:
    (ctx->text_options).mem_level = value;
    break;
  case SPNG_TEXT_COMPRESSION_STRATEGY:
    (ctx->text_options).strategy = value;
    break;
  case SPNG_FILTER_CHOICE:
    if ((value & 0xffffff07U) != 0) {
      return 1;
    }
    (ctx->encode_flags).filter_choice = value;
    break;
  case SPNG_CHUNK_COUNT_LIMIT:
    if (value < 0) {
      return 1;
    }
    if ((int)ctx->chunk_count_total < value) {
      return 1;
    }
    ctx->chunk_count_limit = value;
    break;
  case SPNG_ENCODE_TO_BUFFER:
    if (value < 0) {
      return 1;
    }
    if ((*(ushort *)&ctx->field_0xcc & 0x10) == 0) {
      return 0x51;
    }
    if (ctx->state != SPNG_STATE_INIT) {
      return 0x54;
    }
    if (value != 0) {
      *(ushort *)&ctx->field_0xcc = *(ushort *)&ctx->field_0xcc | 2;
      ctx->state = SPNG_STATE_INPUT;
    }
    break;
  default:
    goto switchD_00108121_default;
  }
  bVar1 = (byte)option & 0x1f;
  ctx->optimize_option = ctx->optimize_option & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
  iVar2 = 0;
switchD_00108121_default:
  return iVar2;
}

Assistant:

int spng_set_option(spng_ctx *ctx, enum spng_option option, int value)
{
    if(ctx == NULL) return 1;
    if(!ctx->state) return SPNG_EBADSTATE;

    switch(option)
    {
        case SPNG_KEEP_UNKNOWN_CHUNKS:
        {
            ctx->keep_unknown = value ? 1 : 0;
            break;
        }
        case SPNG_IMG_COMPRESSION_LEVEL:
        {
            ctx->image_options.compression_level = value;
            break;
        }
        case SPNG_IMG_WINDOW_BITS:
        {
            ctx->image_options.window_bits = value;
            break;
        }
        case SPNG_IMG_MEM_LEVEL:
        {
            ctx->image_options.mem_level = value;
            break;
        }
        case SPNG_IMG_COMPRESSION_STRATEGY:
        {
            ctx->image_options.strategy = value;
            break;
        }
        case SPNG_TEXT_COMPRESSION_LEVEL:
        {
            ctx->text_options.compression_level = value;
            break;
        }
        case SPNG_TEXT_WINDOW_BITS:
        {
            ctx->text_options.window_bits = value;
            break;
        }
        case SPNG_TEXT_MEM_LEVEL:
        {
            ctx->text_options.mem_level = value;
            break;
        }
        case SPNG_TEXT_COMPRESSION_STRATEGY:
        {
            ctx->text_options.strategy = value;
            break;
        }
        case SPNG_FILTER_CHOICE:
        {
            if(value & ~SPNG_FILTER_CHOICE_ALL) return 1;
            ctx->encode_flags.filter_choice = value;
            break;
        }
        case SPNG_CHUNK_COUNT_LIMIT:
        {
            if(value < 0) return 1;
            if(value > (int)ctx->chunk_count_total) return 1;
            ctx->chunk_count_limit = value;
            break;
        }
        case SPNG_ENCODE_TO_BUFFER:
        {
            if(value < 0) return 1;
            if(!ctx->encode_only) return SPNG_ECTXTYPE;
            if(ctx->state >= SPNG_STATE_OUTPUT) return SPNG_EOPSTATE;

            if(!value) break;

            ctx->internal_buffer = 1;
            ctx->state = SPNG_STATE_OUTPUT;

            break;
        }
        default: return 1;
    }

    /* Option can no longer be overriden by the library */
    if(option < 32) ctx->optimize_option &= ~(1 << option);

    return 0;
}